

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::LoopTestOverS<int,false,2u,true>
          (StorageAndSubImageTest *this,bool skip_rgb)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  
  PrepareProgram(this,s_fragment_shader_2D_idecl_mediump,s_fragment_shader_2D_tail);
  bVar1 = Test<int,1,false,2u,true>(this);
  bVar2 = Test<int,2,false,2u,true>(this);
  bVar2 = bVar2 && bVar1;
  if ((int)CONCAT71(in_register_00000031,skip_rgb) == 0) {
    bVar1 = Test<int,3,false,2u,true>(this);
    bVar2 = bVar2 && bVar1;
  }
  bVar1 = Test<int,4,false,2u,true>(this);
  CleanProgram(this);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  do {
    iVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  } while (iVar4 != 0);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool StorageAndSubImageTest::LoopTestOverS(bool skip_rgb)
{
	/* Prepare one program per test loop. */
	PrepareProgram(FragmentShaderDeclaration<T, N, D>(), FragmentShaderTail<D>());

	/* Run tests. */
	bool result = true;

	result &= Test<T, 1, N, D, I>();

	result &= Test<T, 2, N, D, I>();

	if (!skip_rgb)
	{
		result &= Test<T, 3, N, D, I>();
	}

	result &= Test<T, 4, N, D, I>();

	/* Cleanup.*/
	CleanProgram();
	CleanErrors();

	/* Pass result. */
	return result;
}